

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t ra_portable_size_in_bytes(roaring_array_t *ra)

{
  uint32_t uVar1;
  int32_t iVar2;
  int local_1c;
  ulong uStack_18;
  int32_t k;
  size_t count;
  roaring_array_t *ra_local;
  
  uVar1 = ra_portable_header_size(ra);
  uStack_18 = (ulong)uVar1;
  for (local_1c = 0; local_1c < ra->size; local_1c = local_1c + 1) {
    iVar2 = container_size_in_bytes(ra->containers[local_1c],ra->typecodes[local_1c]);
    uStack_18 = (long)iVar2 + uStack_18;
  }
  return uStack_18;
}

Assistant:

size_t ra_portable_size_in_bytes(const roaring_array_t *ra) {
    size_t count = ra_portable_header_size(ra);

    for (int32_t k = 0; k < ra->size; ++k) {
        count += container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
    }
    return count;
}